

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O1

_Bool ggml_backend_cpu_device_supports_op(ggml_backend_dev_t dev,ggml_tensor *op)

{
  ggml_op gVar1;
  ggml_type gVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  long *plVar5;
  long lVar6;
  undefined8 uVar7;
  pointer ppgVar8;
  char cVar9;
  ggml_type_traits_cpu *pgVar10;
  pointer ppgVar11;
  long lVar12;
  byte bVar13;
  
  pgVar3 = op->src[0];
  pgVar4 = op->src[1];
  if (((ulong)op->op < 0x26) && (bVar13 = 1, (0x3c00000001U >> ((ulong)op->op & 0x3f) & 1) != 0))
  goto LAB_00110db4;
  ggml_backend_cpu_get_extra_buffers_type();
  ppgVar8 = ggml_backend_cpu_get_extra_buffers_type::bufts.
            super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppgVar11 = ggml_backend_cpu_get_extra_buffers_type::bufts.
                  super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppgVar11 != ppgVar8;
      ppgVar11 = ppgVar11 + 1) {
    if (((*ppgVar11 != (ggml_backend_buffer_type *)0x0) &&
        (plVar5 = (long *)(*ppgVar11)->context, plVar5 != (long *)0x0)) &&
       (cVar9 = (**(code **)(*plVar5 + 0x10))(plVar5,dev,op), cVar9 != '\0')) {
      bVar13 = 1;
      goto LAB_00110db4;
    }
  }
  lVar12 = 0x13;
  do {
    if (((op->ne[lVar12 + -2] != 0) && (lVar6 = *(long *)(op->ne[lVar12 + -2] + 8), lVar6 != 0)) &&
       (cVar9 = ggml_backend_buft_is_host(*(undefined8 *)(lVar6 + 0x48)), cVar9 == '\0'))
    goto LAB_00110db2;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x1d);
  gVar1 = op->op;
  bVar13 = 1;
  if ((int)gVar1 < 0x27) {
    if (gVar1 == GGML_OP_MUL_MAT) {
      gVar2 = pgVar4->type;
      if (gVar2 != GGML_TYPE_F32) {
        pgVar10 = ggml_get_type_traits_cpu(pgVar3->type);
        bVar13 = gVar2 == pgVar10->vec_dot_type;
      }
      goto LAB_00110db4;
    }
    if (gVar1 != GGML_OP_OUT_PROD) {
      if ((gVar1 == GGML_OP_CPY) && (op->type < GGML_TYPE_BF16)) {
        bVar13 = (byte)(0x1f90ffff >> (op->type & (GGML_TYPE_BF16|GGML_TYPE_F16)));
      }
      goto LAB_00110db4;
    }
    if (((pgVar3->type == GGML_TYPE_F32) ||
        (((cVar9 = ggml_is_quantized(), cVar9 != '\0' && (pgVar3->ne[2] == pgVar4->ne[2])) &&
         (pgVar3->ne[3] == pgVar4->ne[3])))) && (pgVar4->type == GGML_TYPE_F32)) {
      bVar13 = op->type == GGML_TYPE_F32;
      goto LAB_00110db4;
    }
  }
  else {
    if (gVar1 == GGML_OP_GET_ROWS_BACK) {
      bVar13 = pgVar3->type < GGML_TYPE_Q4_0;
      goto LAB_00110db4;
    }
    if (gVar1 == GGML_OP_SOFT_MAX_BACK) {
      if ((op->src[0]->type == GGML_TYPE_F32) && (op->src[1]->type == GGML_TYPE_F32)) {
        uVar7 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)op->op_params[1]),0);
        bVar13 = (byte)uVar7 & 1;
        goto LAB_00110db4;
      }
    }
    else {
      if (gVar1 != GGML_OP_IM2COL_BACK) goto LAB_00110db4;
      if (pgVar3->type == GGML_TYPE_F32) {
        bVar13 = pgVar4->type == GGML_TYPE_F32;
        goto LAB_00110db4;
      }
    }
  }
LAB_00110db2:
  bVar13 = 0;
LAB_00110db4:
  return (_Bool)(bVar13 & 1);
}

Assistant:

static bool ggml_backend_cpu_device_supports_op(ggml_backend_dev_t dev, const struct ggml_tensor * op) {
    const struct ggml_tensor * src0 = op->src[0];
    const struct ggml_tensor * src1 = op->src[1];

    if (op->op == GGML_OP_NONE || op->op == GGML_OP_RESHAPE || op->op == GGML_OP_VIEW || op->op == GGML_OP_PERMUTE || op->op == GGML_OP_TRANSPOSE) {
        return true;
    }

    // extra_buffer_op?
    for (auto extra : ggml_backend_cpu_get_extra_buffers_type()) {
        if (extra) {
            auto buf_extra = (ggml::cpu::extra_buffer_type*) extra->context;
            if (buf_extra && buf_extra->supports_op(dev, op)) {
                return true;
            }
        }
    }

    // the other case need host buffer.
    for (int i = 0; i < GGML_MAX_SRC; i++) {
        if (op->src[i] && op->src[i]->buffer && !ggml_backend_buft_is_host(op->src[i]->buffer->buft)) {
            return false;
        }
    }

    switch (op->op) {
        case GGML_OP_CPY:
            return
                op->type != GGML_TYPE_IQ3_XXS &&
                op->type != GGML_TYPE_IQ3_S   &&
                op->type != GGML_TYPE_IQ2_XXS &&
                op->type != GGML_TYPE_IQ2_XS  &&
                op->type != GGML_TYPE_IQ2_S   &&
                op->type != GGML_TYPE_IQ1_S   &&
                op->type != GGML_TYPE_IQ1_M; // missing type_traits.from_float
        case GGML_OP_MUL_MAT:
            return src1->type == GGML_TYPE_F32 || src1->type == ggml_get_type_traits_cpu(src0->type)->vec_dot_type;
        case GGML_OP_SOFT_MAX_BACK: {
            if (op->src[0]->type != GGML_TYPE_F32 || op->src[1]->type != GGML_TYPE_F32) {
                return false;
            }
            float max_bias = 0.0f;

            memcpy(&max_bias, (const float *) op->op_params + 1, sizeof(float));

            return max_bias == 0.0f;
        }
        case GGML_OP_IM2COL_BACK:
            return src0->type == GGML_TYPE_F32 && src1->type == GGML_TYPE_F32;
        case GGML_OP_GET_ROWS_BACK:
            return src0->type == GGML_TYPE_F32 || src0->type == GGML_TYPE_F16;
        case GGML_OP_OUT_PROD:
            return (src0->type == GGML_TYPE_F32 || (ggml_is_quantized(src0->type) && src0->ne[2] == src1->ne[2] && src0->ne[3] == src1->ne[3])) &&
                src1->type == GGML_TYPE_F32 && op->type == GGML_TYPE_F32;
        default:
            return true;
    }
}